

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O1

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::scan(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  Id IVar1;
  bool bVar2;
  char *__function;
  Expression *currp_00;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  Block *block;
  Expression *pEVar6;
  long lVar7;
  uint local_44;
  vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
  *pvStack_40;
  Index index;
  Scanner *local_38;
  
  pvStack_40 = &self->cleanupStack;
  local_38 = self;
LAB_00728909:
  pEVar6 = *currp;
  IVar1 = pEVar6->_id;
  switch(IVar1) {
  case InvalidId:
    handle_unreachable("bad id",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                       ,0x89);
  case BlockId:
    if (pEVar6[1].type.id != 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
    }
    uVar3 = (uint)pEVar6[2].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[2].type.id <= lVar7 - 2U) {
LAB_0072941d:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 2) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    if (pEVar6[1].type.id != 0) {
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::emplace_back<>(pvStack_40);
    }
    goto LAB_007289a8;
  case IfId:
    if (*(long *)(pEVar6 + 2) == 0) {
LAB_00728ace:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      if (pEVar6->_id == IfId) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pEVar6[1].type);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doBeginScope(Scanner*,wasm::Expression___,currp);
        if (pEVar6->_id == IfId) goto LAB_00728b1b;
      }
    }
    else {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      if (pEVar6->_id == IfId) {
        if (*(Expression **)(pEVar6 + 2) != (Expression *)0x0) {
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                     (Expression **)(pEVar6 + 2));
        }
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doBeginScope(Scanner*,wasm::Expression___,currp);
        goto LAB_00728ace;
      }
    }
    __function = "T *wasm::Expression::cast() [T = wasm::If]";
LAB_007294c5:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,__function);
  case LoopId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
               doEndScope(Scanner*,wasm::Expression___,currp);
    std::
    vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
    ::emplace_back<>(pvStack_40);
    if (pEVar6->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_007294c5;
    }
    currp = (Expression **)(pEVar6 + 2);
    goto LAB_00728b51;
  case BreakId:
  case SwitchId:
  case CallId:
  case CallIndirectId:
    break;
  case LocalGetId:
    if (pEVar6->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_007294c5;
    }
    local_44 = *(uint *)(pEVar6 + 1);
    if (((self->localsSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_44 >> 6] >>
         ((ulong)local_44 & 0x3f) & 1) == 0) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)self->nonDominatingIndices,&local_44);
    }
LAB_00728a48:
    bVar2 = true;
    goto switchD_00728a05_caseD_8;
  case LocalSetId:
    if (((self->localsSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[*(uint *)(pEVar6 + 1) >> 6]
         >> ((ulong)*(uint *)(pEVar6 + 1) & 0x3f) & 1) == 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doLocalSet(Scanner*,wasm::Expression___,currp);
    }
    currp = (Expression **)&pEVar6[1].type;
    goto LAB_00728b51;
  default:
    if (IVar1 == TryId) {
      if (0 < (int)(uint)*(undefined8 *)(pEVar6 + 5)) {
        uVar5 = (ulong)((uint)*(undefined8 *)(pEVar6 + 5) & 0x7fffffff);
        lVar4 = uVar5 * 8;
        lVar7 = uVar5 + 1;
        do {
          lVar4 = lVar4 + -8;
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                     doEndScope(Scanner*,wasm::Expression___,currp);
          if (*(ulong *)(pEVar6 + 5) <= lVar7 - 2U) goto LAB_0072941d;
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                     (Expression **)(pEVar6[4].type.id + lVar4));
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                     doBeginScope(Scanner*,wasm::Expression___,currp);
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::emplace_back<>(pvStack_40);
      if (pEVar6->_id != TryId) {
        __function = "T *wasm::Expression::cast() [T = wasm::Try]";
        goto LAB_007294c5;
      }
      currp = (Expression **)(pEVar6 + 2);
      bVar2 = false;
      self = local_38;
      goto switchD_00728a05_caseD_8;
    }
    if (IVar1 != TryTableId) break;
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
               doEndScope(Scanner*,wasm::Expression___,currp);
    std::
    vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
    ::emplace_back<>(pvStack_40);
    if (pEVar6->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_007294c5;
    }
LAB_00728b1b:
    currp = (Expression **)(pEVar6 + 1);
LAB_00728b51:
    bVar2 = false;
    goto switchD_00728a05_caseD_8;
  }
  bVar2 = true;
  switch(IVar1) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    uVar3 = (uint)pEVar6[2].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[2].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 2) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case IfId:
    if (*(long *)(pEVar6 + 2) != 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar6 + 2));
    }
  case SIMDShuffleId:
  case RefEqId:
  case ArrayGetId:
  case StringConcatId:
  case StringWTF16GetId:
LAB_0072936f:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[1].type);
    pEVar6 = pEVar6 + 1;
    goto LAB_00729382;
  case LoopId:
  case GlobalSetId:
  case TableGetId:
switchD_00728a05_caseD_3:
    pEVar6 = pEVar6 + 2;
    goto LAB_00729382;
  case BreakId:
    if (pEVar6[2].type.id != 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar6[2].type);
    }
    if (*(long *)(pEVar6 + 2) != 0) goto switchD_00728a05_caseD_3;
    goto switchD_00728a05_caseD_8;
  case SwitchId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[4].type);
    if (*(long *)(pEVar6 + 4) != 0) {
      pEVar6 = pEVar6 + 4;
      goto LAB_00729382;
    }
    goto switchD_00728a05_caseD_8;
  case CallId:
    uVar3 = (uint)pEVar6[1].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[1].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 1) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case CallIndirectId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar6 + 2)) {
      uVar5 = (ulong)((uint)*(undefined8 *)(pEVar6 + 2) & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar6 + 2) <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(pEVar6[1].type.id + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  default:
    goto switchD_00728a05_caseD_8;
  case LocalSetId:
  case UnaryId:
  case SIMDExtractId:
  case StructGetId:
  case RefAsId:
  case StringMeasureId:
    goto switchD_00728a05_caseD_9;
  case LoadId:
    pEVar6 = pEVar6 + 3;
    goto LAB_00729382;
  case StoreId:
  case SIMDLoadStoreLaneId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[3].type);
    pEVar6 = pEVar6 + 3;
    goto LAB_00729382;
  case BinaryId:
  case AtomicNotifyId:
  case SIMDShiftId:
  case StructSetId:
  case StructRMWId:
  case StringEqId:
    goto switchD_00728a05_caseD_10;
  case SelectId:
  case MemoryCopyId:
  case MemoryFillId:
  case TableCopyId:
  case ArraySetId:
  case StringSliceWTFId:
    goto LAB_0072935c;
  case DropId:
  case MemoryGrowId:
  case RefIsNullId:
  case TryTableId:
  case ThrowRefId:
  case TupleExtractId:
  case RefI31Id:
  case I31GetId:
  case RefTestId:
  case RefCastId:
  case ArrayLenId:
  case ContNewId:
    goto switchD_00728a05_caseD_12;
  case ReturnId:
    goto switchD_00728a05_caseD_13;
  case AtomicRMWId:
  case TableSetId:
  case TableGrowId:
  case ArrayNewDataId:
  case ArrayNewElemId:
    goto LAB_00728ccf;
  case AtomicCmpxchgId:
  case MemoryInitId:
  case TableFillId:
  case TableInitId:
    goto LAB_00728cbc;
  case AtomicWaitId:
  case SIMDTernaryId:
  case StructCmpxchgId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[2].type);
    currp_00 = pEVar6 + 2;
    goto LAB_00728fbd;
  case SIMDReplaceId:
    currp_00 = (Expression *)&pEVar6[2].type;
    goto LAB_00728fbd;
  case SIMDLoadId:
  case BrOnId:
    pEVar6 = (Expression *)&pEVar6[2].type;
    goto LAB_00729382;
  case TryId:
    if (0 < (int)(uint)*(undefined8 *)(pEVar6 + 5)) {
      uVar5 = (ulong)((uint)*(undefined8 *)(pEVar6 + 5) & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar6 + 5) <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(pEVar6[4].type.id + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    self = local_38;
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
               (Expression **)(pEVar6 + 2));
    goto LAB_00728a48;
  case ThrowId:
    uVar3 = (uint)pEVar6[2].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[2].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 2) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case TupleMakeId:
    uVar3 = (uint)pEVar6[1].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[1].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 1) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case CallRefId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 3));
    uVar3 = (uint)pEVar6[1].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[1].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 1) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case StructNewId:
    uVar3 = (uint)pEVar6[1].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[1].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 1) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case ArrayNewId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[1].type);
switchD_00728a05_caseD_13:
    if (*(long *)(pEVar6 + 1) != 0) {
switchD_00728a05_caseD_12:
      pEVar6 = pEVar6 + 1;
      goto LAB_00729382;
    }
    goto switchD_00728a05_caseD_8;
  case ArrayNewFixedId:
    uVar3 = (uint)pEVar6[1].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[1].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 1) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case ArrayCopyId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 3));
    goto LAB_00729349;
  case ArrayFillId:
LAB_00729349:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[2].type);
LAB_0072935c:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 2));
    goto LAB_0072936f;
  case ArrayInitDataId:
  case ArrayInitElemId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[3].type);
LAB_00728cbc:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 3));
LAB_00728ccf:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)&pEVar6[2].type);
    pEVar6 = pEVar6 + 2;
    goto LAB_00729382;
  case StringNewId:
    if (pEVar6[2].type.id != 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar6[2].type);
    }
    if (*(long *)(pEVar6 + 2) != 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar6 + 2));
    }
    goto switchD_00728a05_caseD_9;
  case StringEncodeId:
    if (pEVar6[2].type.id != 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar6[2].type);
    }
    goto switchD_00728a05_caseD_10;
  case ContBindId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 3));
    uVar3 = (uint)pEVar6[1].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[1].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 1) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case SuspendId:
    uVar3 = (uint)pEVar6[2].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[2].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 2) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case ResumeId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 7));
    uVar3 = (uint)pEVar6[5].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[5].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 5) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case ResumeThrowId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 8));
    uVar3 = (uint)pEVar6[6].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[6].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 6) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    break;
  case StackSwitchId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)(pEVar6 + 4));
    uVar3 = (uint)pEVar6[2].type.id;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      lVar4 = uVar5 * 8;
      lVar7 = uVar5 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar6[2].type.id <= lVar7 - 2U) goto LAB_0072941d;
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)local_38,Expression___,
                   (Expression **)(*(long *)(pEVar6 + 2) + lVar4));
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
  }
LAB_007289a8:
  bVar2 = true;
  self = local_38;
switchD_00728a05_caseD_8:
  if (bVar2) {
    return;
  }
  goto LAB_00728909;
switchD_00728a05_caseD_10:
  currp_00 = pEVar6 + 2;
LAB_00728fbd:
  Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
            ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
             (Expression **)currp_00);
  pEVar6 = (Expression *)&pEVar6[1].type;
LAB_00729382:
  Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
            ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
             (Expression **)pEVar6);
  goto switchD_00728a05_caseD_8;
switchD_00728a05_caseD_9:
  pEVar6 = (Expression *)&pEVar6[1].type;
  goto LAB_00729382;
}

Assistant:

static void scan(Scanner* self, Expression** currp) {
      // Use a loop to avoid recursing on the last child - we can just go
      // straight into a loop iteration for it.
      while (1) {
        Expression* curr = *currp;

        switch (curr->_id) {
          case Expression::Id::InvalidId:
            WASM_UNREACHABLE("bad id");

          // local.get can just be visited immediately, as it has no children.
          case Expression::Id::LocalGetId: {
            auto index = curr->cast<LocalGet>()->index;
            if (!self->localsSet[index]) {
              self->nonDominatingIndices.insert(index);
            }
            return;
          }
          case Expression::Id::LocalSetId: {
            auto* set = curr->cast<LocalSet>();
            if (!self->localsSet[set->index]) {
              self->pushTask(doLocalSet, currp);
            }
            // Immediately continue in the loop.
            currp = &set->value;
            continue;
          }

          // Control flow structures.
          case Expression::Id::BlockId: {
            auto* block = curr->cast<Block>();
            // Blocks with no name are never emitted in the binary format, so do
            // not create a scope for them.
            if (block->name.is()) {
              self->pushTask(Scanner::doEndScope, currp);
            }
            auto& list = block->list;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::scan, &list[i]);
            }
            if (block->name.is()) {
              // Just call the task immediately.
              doBeginScope(self, currp);
            }
            return;
          }
          case Expression::Id::IfId: {
            if (curr->cast<If>()->ifFalse) {
              self->pushTask(Scanner::doEndScope, currp);
              self->maybePushTask(Scanner::scan, &curr->cast<If>()->ifFalse);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            self->pushTask(Scanner::scan, &curr->cast<If>()->ifTrue);
            self->pushTask(Scanner::doBeginScope, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<If>()->condition;
            continue;
          }
          case Expression::Id::LoopId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Loop>()->body;
            continue;
          }
          case Expression::Id::TryId: {
            auto& list = curr->cast<Try>()->catchBodies;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::doEndScope, currp);
              self->pushTask(Scanner::scan, &list[i]);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Try>()->body;
            continue;
          }
          case Expression::Id::TryTableId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the try_table.
            currp = &curr->cast<TryTable>()->body;
            continue;
          }

          default: {
            // Control flow structures have been handled. This is an expression,
            // which we scan normally.
            assert(!Properties::isControlFlowStructure(curr));
            PostWalker<Scanner>::scan(self, currp);
            return;
          }
        }
      }
    }